

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skiplist.cpp
# Opt level: O0

bool __thiscall Skiplist::put(Skiplist *this,uint64_t k,string *v,bool d)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  Quadlist *this_00;
  reference ppQVar4;
  reference ppQVar5;
  _List_iterator<Quadlist_*> this_01;
  Quadlistnode *pQVar6;
  reverse_iterator<std::_List_iterator<Quadlist_*>_> local_d0;
  reverse_iterator<std::_List_iterator<Quadlist_*>_> local_c8;
  reverse_iterator<std::_List_iterator<Quadlist_*>_> local_c0;
  reverse_iterator temp_1;
  Quadlist *newTop;
  reverse_iterator<std::_List_iterator<Quadlist_*>_> local_a8;
  reverse_iterator<std::_List_iterator<Quadlist_*>_> local_a0;
  reverse_iterator temp;
  Quadlistnode *b;
  reverse_iterator r_qlist;
  Quadlistnode *local_80;
  Quadlistnode *p;
  iterator qlist;
  Quadlist *bottomm;
  undefined1 local_58 [8];
  Entry e;
  bool d_local;
  string *v_local;
  uint64_t k_local;
  Skiplist *this_local;
  
  e.value.field_2._M_local_buf[0xf] = d;
  Entry::Entry((Entry *)local_58);
  local_58 = (undefined1  [8])k;
  std::__cxx11::string::operator=((string *)&e,(string *)v);
  bVar1 = empty(this);
  if (bVar1) {
    this_00 = (Quadlist *)operator_new(0x18);
    Quadlist::Quadlist(this_00);
    qlist._M_node = (_List_node_base *)this_00;
    std::__cxx11::list<Quadlist_*,_std::allocator<Quadlist_*>_>::push_front
              (&this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>,(value_type *)&qlist);
  }
  p = (Quadlistnode *)
      std::__cxx11::list<Quadlist_*,_std::allocator<Quadlist_*>_>::begin
                (&this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>);
  ppQVar4 = std::_List_iterator<Quadlist_*>::operator*((_List_iterator<Quadlist_*> *)&p);
  local_80 = Quadlist::first(*ppQVar4);
  bVar1 = skipSearch1(this,(iterator *)&p,&local_80,k);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&(local_80->entry).value,(string *)v);
    local_80->del = (bool)(e.value.field_2._M_local_buf[0xf] & 1);
    while (local_80->below != (Quadlistnode *)0x0) {
      local_80 = local_80->below;
      std::__cxx11::string::operator=((string *)&(local_80->entry).value,(string *)v);
      local_80->del = (bool)(e.value.field_2._M_local_buf[0xf] & 1);
    }
  }
  else {
    std::__cxx11::list<Quadlist_*,_std::allocator<Quadlist_*>_>::rbegin
              ((list<Quadlist_*,_std::allocator<Quadlist_*>_> *)&b);
    ppQVar5 = std::reverse_iterator<std::_List_iterator<Quadlist_*>_>::operator*
                        ((reverse_iterator<std::_List_iterator<Quadlist_*>_> *)&b);
    temp.current._M_node =
         (_List_iterator<Quadlist_*>)
         Quadlist::insertAfterAbove
                   (*ppQVar5,(Entry *)local_58,local_80,(Quadlistnode *)0x0,
                    (bool)(e.value.field_2._M_local_buf[0xf] & 1));
    while (uVar3 = rand(), (uVar3 & 1) != 0) {
      while( true ) {
        ppQVar5 = std::reverse_iterator<std::_List_iterator<Quadlist_*>_>::operator*
                            ((reverse_iterator<std::_List_iterator<Quadlist_*>_> *)&b);
        bVar2 = Quadlist::valid(*ppQVar5,local_80);
        bVar1 = false;
        if (bVar2) {
          bVar1 = local_80->above == (Quadlistnode *)0x0;
        }
        if (!bVar1) break;
        local_80 = local_80->pred;
      }
      ppQVar5 = std::reverse_iterator<std::_List_iterator<Quadlist_*>_>::operator*
                          ((reverse_iterator<std::_List_iterator<Quadlist_*>_> *)&b);
      bVar1 = Quadlist::valid(*ppQVar5,local_80);
      if (bVar1) {
        local_80 = local_80->above;
      }
      else {
        std::reverse_iterator<std::_List_iterator<Quadlist_*>_>::reverse_iterator
                  (&local_a0,(reverse_iterator<std::_List_iterator<Quadlist_*>_> *)&b);
        std::reverse_iterator<std::_List_iterator<Quadlist_*>_>::operator++
                  (&local_a8,(int)&local_a0);
        std::__cxx11::list<Quadlist_*,_std::allocator<Quadlist_*>_>::rend
                  ((list<Quadlist_*,_std::allocator<Quadlist_*>_> *)&newTop);
        bVar1 = std::operator==(&local_a0,
                                (reverse_iterator<std::_List_iterator<Quadlist_*>_> *)&newTop);
        if (bVar1) {
          this_01._M_node = (_List_node_base *)operator_new(0x18);
          Quadlist::Quadlist((Quadlist *)this_01._M_node);
          temp_1.current._M_node =
               (_List_iterator<Quadlist_*>)(_List_iterator<Quadlist_*>)this_01._M_node;
          std::__cxx11::list<Quadlist_*,_std::allocator<Quadlist_*>_>::push_front
                    (&this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>,
                     (value_type *)&temp_1);
          pQVar6 = Quadlist::first((Quadlist *)temp_1.current._M_node);
          local_80 = pQVar6->pred;
        }
        else {
          std::reverse_iterator<std::_List_iterator<Quadlist_*>_>::reverse_iterator
                    (&local_c0,(reverse_iterator<std::_List_iterator<Quadlist_*>_> *)&b);
          std::reverse_iterator<std::_List_iterator<Quadlist_*>_>::operator++
                    (&local_c8,(int)&local_c0);
          ppQVar5 = std::reverse_iterator<std::_List_iterator<Quadlist_*>_>::operator*(&local_c0);
          pQVar6 = Quadlist::first(*ppQVar5);
          local_80 = pQVar6->pred;
        }
      }
      std::reverse_iterator<std::_List_iterator<Quadlist_*>_>::operator++(&local_d0,(int)&b);
      ppQVar5 = std::reverse_iterator<std::_List_iterator<Quadlist_*>_>::operator*
                          ((reverse_iterator<std::_List_iterator<Quadlist_*>_> *)&b);
      temp.current._M_node =
           (_List_iterator<Quadlist_*>)
           Quadlist::insertAfterAbove
                     (*ppQVar5,(Entry *)local_58,local_80,(Quadlistnode *)temp.current._M_node,
                      (bool)(e.value.field_2._M_local_buf[0xf] & 1));
    }
  }
  r_qlist.current._M_node._4_4_ = 1;
  Entry::~Entry((Entry *)local_58);
  return true;
}

Assistant:

bool Skiplist::put(uint64_t k,const std::string &v,bool d) {
    Entry e;

    e.key=k;
    e.value=v;


    if(empty())
    {
        Quadlist * bottomm = new Quadlist();
        push_front(bottomm);

    }

    list::iterator qlist=begin();   //顶层那条四联表  用迭代器！！！
    Quadlistnode * p=(*qlist)->first();//顶层四联表的第一个元素

    //如果找到这个元素 改变他的值 为v
    //memtable里的k不重复 插入相同k直接覆盖
    if(skipSearch1(qlist,p,k))  //这里传的都是引用哦！！
    {
//        big-=p->entry.value.size();
      //  big+=v.size();
        p->entry.value=v;
        p->del=d;
        while (p->below)
        {
            p=p->below;
            p->entry.value=v;
            p->del=d;
        }
        return true;

    }


    //skipSearch之后 如果没找到 qlist就是底层，p是比k小的最大的那个
    list::reverse_iterator r_qlist=rbegin();
    Quadlistnode * b = (*r_qlist)->insertAfterAbove(e,p,nullptr,d); //新底座
    while(rand()&1)
    {
        //找到这条链比k小的 并且头上有东西的
        while ((*r_qlist)->valid(p) && !p->above) p=p->pred;

        //如果pred是header 就说明 比k小的没有这么高的了
        if(!(*r_qlist)->valid(p))
        {
            reverse_iterator temp =r_qlist;
            temp++;
            if(temp==rend()) //说明是顶层了
            {
                //新建一层
                Quadlist * newTop = new Quadlist();
                push_front(newTop);

                p=newTop->first()->pred;
            } else {
                reverse_iterator temp = r_qlist;
                temp++;
                p = (*temp)->first()->pred;  //让p等于上一层的header (private)}
            }

        }
        else{
            p=p->above;
        }

        r_qlist++;//上升一层
        b= (*r_qlist)->insertAfterAbove(e,p,b,d);
    }


    return true;
}